

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

lys_module * lys_parse_path(ly_ctx *ctx,char *path,LYS_INFORMAT format)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  size_t __n;
  lys_revision *local_1080;
  char local_1058 [8];
  char rpath [4096];
  size_t len;
  char *filename;
  char *dot;
  char *rev;
  lys_module *ret;
  int fd;
  LYS_INFORMAT format_local;
  char *path_local;
  ly_ctx *ctx_local;
  
  if ((ctx == (ly_ctx *)0x0) || (path == (char *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_parse_path");
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    iVar1 = open(path,0);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      ly_log(ctx,LY_LLERR,LY_ESYS,"Opening file \"%s\" failed (%s).",path,pcVar3);
      ctx_local = (ly_ctx *)0x0;
    }
    else {
      ctx_local = (ly_ctx *)lys_parse_fd(ctx,iVar1,format);
      close(iVar1);
      if ((lys_module *)ctx_local == (lys_module *)0x0) {
        ctx_local = (ly_ctx *)0x0;
      }
      else {
        pcVar3 = strrchr(path,0x2f);
        len = (size_t)path;
        if (pcVar3 != (char *)0x0) {
          len = (size_t)(pcVar3 + 1);
        }
        pcVar3 = strchr((char *)len,0x40);
        pcVar4 = strrchr((char *)len,0x2e);
        __n = strlen(((lys_module *)ctx_local)->name);
        iVar1 = strncmp((char *)len,((lys_module *)ctx_local)->name,__n);
        if (((iVar1 != 0) || ((pcVar3 != (char *)0x0 && (pcVar3 != (char *)(len + __n))))) ||
           ((pcVar3 == (char *)0x0 && (pcVar4 != (char *)(len + __n))))) {
          ly_log(ctx,LY_LLWRN,LY_SUCCESS,"File name \"%s\" does not match module name \"%s\".",len,
                 ((lys_module *)ctx_local)->name);
        }
        if (pcVar3 != (char *)0x0) {
          if (((((lys_module *)ctx_local)->rev_size == '\0') ||
              ((long)pcVar4 - (long)(pcVar3 + 1) != 10)) ||
             (iVar1 = strncmp(((lys_module *)ctx_local)->rev->date,pcVar3 + 1,10), iVar1 != 0)) {
            if (((lys_module *)ctx_local)->rev_size == '\0') {
              local_1080 = (lys_revision *)0x1eacff;
            }
            else {
              local_1080 = ((lys_module *)ctx_local)->rev;
            }
            ly_log(ctx,LY_LLWRN,LY_SUCCESS,"File name \"%s\" does not match module revision \"%s\"."
                   ,len,local_1080);
          }
        }
        if (((lys_module *)ctx_local)->filepath == (char *)0x0) {
          pcVar3 = realpath(path,local_1058);
          if (pcVar3 == (char *)0x0) {
            pcVar3 = lydict_insert(ctx,path,0);
            ((lys_module *)ctx_local)->filepath = pcVar3;
          }
          else {
            pcVar3 = lydict_insert(ctx,local_1058,0);
            ((lys_module *)ctx_local)->filepath = pcVar3;
          }
        }
      }
    }
  }
  return (lys_module *)ctx_local;
}

Assistant:

lys_module *
lys_parse_path(struct ly_ctx *ctx, const char *path, LYS_INFORMAT format)
{
    int fd;
    const struct lys_module *ret;
    const char *rev, *dot, *filename;
    size_t len;

    if (!ctx || !path) {
        LOGARG;
        return NULL;
    }

    fd = open(path, O_RDONLY);
    if (fd == -1) {
        LOGERR(ctx, LY_ESYS, "Opening file \"%s\" failed (%s).", path, strerror(errno));
        return NULL;
    }

    ret = lys_parse_fd(ctx, fd, format);
    close(fd);

    if (!ret) {
        /* error */
        return NULL;
    }

    /* check that name and revision match filename */
    filename = strrchr(path, '/');
    if (!filename) {
        filename = path;
    } else {
        filename++;
    }
    rev = strchr(filename, '@');
    dot = strrchr(filename, '.');

    /* name */
    len = strlen(ret->name);
    if (strncmp(filename, ret->name, len) ||
            ((rev && rev != &filename[len]) || (!rev && dot != &filename[len]))) {
        LOGWRN(ctx, "File name \"%s\" does not match module name \"%s\".", filename, ret->name);
    }
    if (rev) {
        len = dot - ++rev;
        if (!ret->rev_size || len != 10 || strncmp(ret->rev[0].date, rev, len)) {
            LOGWRN(ctx, "File name \"%s\" does not match module revision \"%s\".", filename,
                   ret->rev_size ? ret->rev[0].date : "none");
        }
    }

    if (!ret->filepath) {
        /* store URI */
        char rpath[PATH_MAX];
        if (realpath(path, rpath) != NULL) {
            ((struct lys_module *)ret)->filepath = lydict_insert(ctx, rpath, 0);
        } else {
            ((struct lys_module *)ret)->filepath = lydict_insert(ctx, path, 0);
        }
    }

    return ret;
}